

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O1

Real __thiscall NavierStokesBase::predict_velocity(NavierStokesBase *this,Real dt)

{
  Geometry *geom;
  BoxArray *bxs;
  DistributionMapping *dm;
  pointer ppMVar1;
  pointer pSVar2;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  undefined8 uVar3;
  MultiFab *pMVar4;
  BCRec *d_bcrec;
  bool bVar5;
  TimeCenter TVar6;
  int iVar7;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *pVVar8;
  long lVar9;
  int *piVar10;
  int *piVar11;
  long lVar12;
  long lVar13;
  NavierStokesBase *pNVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  Real time;
  Real time_00;
  double __x;
  double dVar19;
  double dVar20;
  initializer_list<const_amrex::MultiFab_*> __l;
  Box gbx;
  Vector<double,_std::allocator<double>_> umax;
  MFIter U_mfi;
  FillPatchIterator S_fpi;
  FillPatchIterator U_fpi;
  MultiFab visc_terms;
  MultiFab forcing_term;
  ulong in_stack_fffffffffffff4d0;
  long local_ae0;
  long local_ad0;
  long local_ac8;
  Box local_abc;
  double local_aa0;
  NavierStokesBase *local_a98;
  long local_a90;
  long local_a88;
  long local_a80;
  long local_a78;
  long local_a70;
  long local_a68;
  long local_a60;
  long local_a58;
  long local_a50;
  long local_a48;
  long local_a40;
  long local_a38;
  long local_a30;
  ulong local_a28;
  Vector<double,_std::allocator<double>_> local_a20;
  MFIter local_a08;
  Array4<const_double> local_9a8;
  Array4<const_double> local_968;
  Array4<const_double> local_928;
  undefined1 local_8e8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8d8;
  int local_8c0;
  undefined1 local_758 [16];
  pointer local_748;
  undefined8 auStack_740 [14];
  FabArray<amrex::FArrayBox> local_6d0;
  undefined1 local_548 [8];
  FabArrayBase *pFStack_540;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_538 [5];
  MultiFab local_4c0;
  FabArray<amrex::FArrayBox> local_330;
  FabArray<amrex::FArrayBox> local_1b0;
  
  if (verbose != 0) {
    pFStack_540 = (FabArrayBase *)amrex::OutStream();
    local_548._4_4_ = *(MPI_Comm *)(DAT_00756620 + -0x48);
    local_548._0_4_ = *(int *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_538);
    *(undefined8 *)
     ((long)&local_538[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish +
     local_538[0].
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
         *(undefined8 *)
          ((long)&(pFStack_540->boxarray).m_bat.m_bat_type +
          (long)pFStack_540->_vptr_FabArrayBase[-3]);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_538,"... predict edge velocities\n",0x1c);
    amrex::Print::~Print((Print *)local_548);
  }
  pSVar2 = (this->super_AmrLevel).state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  TVar6 = amrex::StateDescriptor::timeType(pSVar2->desc);
  if (TVar6 == Point) {
    time = (pSVar2->old_time).stop;
  }
  else {
    time = ((pSVar2->old_time).start + (pSVar2->old_time).stop) * 0.5;
  }
  pSVar2 = (this->super_AmrLevel).state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  TVar6 = amrex::StateDescriptor::timeType(pSVar2[1].desc);
  if (TVar6 == Point) {
    time_00 = pSVar2[1].old_time.stop;
  }
  else {
    time_00 = (pSVar2[1].old_time.start + pSVar2[1].old_time.stop) * 0.5;
  }
  local_aa0 = amrex::ParallelDescriptor::second();
  bxs = &(this->super_AmrLevel).grids;
  dm = &(this->super_AmrLevel).dmap;
  iVar7 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
  local_548 = (undefined1  [8])0x1;
  pFStack_540 = (FabArrayBase *)0x0;
  local_538[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_538[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_538[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::MultiFab
            ((MultiFab *)&local_330,bxs,dm,3,(uint)(iVar7 != 0),(MFInfo *)local_548,
             (this->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_538);
  iVar7 = nghost_state(this);
  pNVar14 = (NavierStokesBase *)local_548;
  amrex::FillPatchIterator::FillPatchIterator
            ((FillPatchIterator *)pNVar14,&this->super_AmrLevel,(MultiFab *)&local_330,iVar7,time,0,
             0,3);
  floor(pNVar14,__x);
  __l._M_len = 1;
  __l._M_array = (iterator)local_8e8;
  local_8e8._0_8_ = (FabArrayBase *)&local_4c0;
  std::vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
            ((vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)local_758,
             __l,(allocator_type *)&local_1b0);
  amrex::VectorMaxAbs(&local_a20,
                      (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                      local_758,(IntVect *)&amrex::FabArrayBase::mfiter_tile_size,0,3,
                      local_4c0.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect[0]);
  if ((FabArrayBase *)local_758._0_8_ != (FabArrayBase *)0x0) {
    operator_delete((void *)local_758._0_8_,(long)local_748 - local_758._0_8_);
  }
  geom = &(this->super_AmrLevel).geom;
  lVar9 = 0;
  dVar20 = (*local_a20.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start * dt) / (this->super_AmrLevel).geom.super_CoordSys.dx[0];
  do {
    dVar19 = (local_a20.super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar9 + 1] * dt) / (this->super_AmrLevel).geom.super_CoordSys.dx[lVar9 + 1];
    if (dVar19 <= dVar20) {
      dVar19 = dVar20;
    }
    lVar9 = lVar9 + 1;
    dVar20 = dVar19;
  } while (lVar9 != 2);
  if ((dVar19 != 0.0) || (NAN(dVar19))) {
    local_758._0_8_ = cfl / dVar19;
    pVVar8 = (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
             &change_max;
    if (cfl / dVar19 < change_max) {
      pVVar8 = (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
               local_758;
    }
  }
  else {
    pVVar8 = (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
             &change_max;
  }
  ppMVar1 = (pVVar8->super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
            ).super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  iVar7 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
  if (((iVar7 == 0) ||
      (iVar7 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_), iVar7 == 0)) ||
     (iVar7 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_), iVar7 == 0)) {
    this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (this->super_AmrLevel).state.
         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
         super__Vector_impl_data._M_start[2].old_data._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    if (0 < (this->super_AmrLevel).level) {
      amrex::AmrLevel::FillPatch
                (&this->super_AmrLevel,
                 (MultiFab *)
                 this_00.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                 ((IntVect *)
                 ((long)this_00.
                        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                        .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0))->vect
                 [0],time_00,2,0,3,0);
    }
    if ((be_cn_theta != 1.0) || (NAN(be_cn_theta))) {
      (*(this->super_AmrLevel)._vptr_AmrLevel[0x33])(time,this,&local_330,0,3);
    }
    else {
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (&local_330,0.0,0,local_330.super_FabArrayBase.n_comp,
                 &local_330.super_FabArrayBase.n_grow);
    }
    iVar7 = nghost_state(this);
    amrex::FillPatchIterator::FillPatchIterator
              ((FillPatchIterator *)local_758,&this->super_AmrLevel,(MultiFab *)&local_330,iVar7,
               time,0,3,NUM_SCALARS);
    iVar7 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
    local_8e8._0_8_ = (FabArrayBase *)0x1;
    local_8e8._8_8_ = (Arena *)0x0;
    local_8d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_8d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_8d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a08.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )&PTR__FabFactory_0074e8d0;
    amrex::MultiFab::MultiFab
              ((MultiFab *)&local_1b0,bxs,dm,3,(uint)(iVar7 != 0),(MFInfo *)local_8e8,
               (FabFactory<amrex::FArrayBox> *)&local_a08);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_8d8);
    amrex::MFIter::MFIter(&local_a08,(FabArrayBase *)&local_4c0,true);
    pNVar14 = this;
    if (local_a08.currentIndex < local_a08.endIndex) {
      do {
        local_a98 = pNVar14;
        pNVar14 = local_a98;
        piVar11 = &local_a08.currentIndex;
        piVar10 = piVar11;
        if (local_a08.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar10 = ((local_a08.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_a08.currentIndex;
        }
        uVar3 = *(undefined8 *)
                 ((long)local_4c0.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                        super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                        _M_impl.super__Vector_impl_data._M_start + (long)*piVar10 * 8);
        iVar7 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
        amrex::MFIter::growntilebox(&local_abc,&local_a08,(uint)(iVar7 != 0));
        if (getForceVerbose != 0) {
          local_8e8._8_8_ = amrex::OutStream();
          local_8e8._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
          local_8e8._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_8d8);
          *(undefined8 *)
           ((long)&local_8d8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish +
           local_8d8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
               *(undefined8 *)
                ((long)&((ArenaInfo *)(local_8e8._8_8_ + 8))->release_threshold +
                (long)(*(_func_int ***)local_8e8._8_8_)[-3]);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_8d8,"---\nA - Predict velocity:\n Calling getForce...\n",0x2f
                    );
          amrex::Print::~Print((Print *)local_8e8);
        }
        piVar10 = piVar11;
        if (local_a08.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar10 = ((local_a08.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_a08.currentIndex;
        }
        if (local_a08.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar11 = ((local_a08.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_a08.currentIndex;
        }
        in_stack_fffffffffffff4d0 = in_stack_fffffffffffff4d0 & 0xffffffff00000000;
        (*(pNVar14->super_AmrLevel)._vptr_AmrLevel[0x2a])
                  (time,pNVar14,
                   local_1b0.m_fabs_v.
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[*piVar10],&local_abc,0,3,uVar3,
                   local_6d0.m_fabs_v.
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[*piVar11],in_stack_fffffffffffff4d0,
                   &local_a08);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)local_8e8,&local_1b0,&local_a08,0);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_968,&local_330,&local_a08,0);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_9a8,
                   (FabArray<amrex::FArrayBox> *)
                   this_00.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_a08);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_928,&local_6d0,&local_a08);
        lVar13 = (long)local_abc.smallend.vect[1];
        lVar9 = (long)local_abc.smallend.vect[0];
        local_a30 = (lVar13 - local_928.begin.y) * local_928.jstride * 8 + lVar9 * 8 +
                    (long)local_928.begin.x * -8 + (long)local_928.p;
        local_a38 = local_928.kstride * 8;
        local_a40 = -(long)local_928.begin.z;
        local_ae0 = (lVar13 - local_9a8.begin.y) * local_9a8.jstride * 8 + lVar9 * 8 +
                    (long)local_9a8.begin.x * -8 + (long)local_9a8.p;
        local_a80 = local_9a8.nstride * 8;
        local_a48 = local_9a8.kstride * 8;
        local_ac8 = (lVar13 - local_968.begin.y) * local_968.jstride * 8 + lVar9 * 8 +
                    (long)local_968.begin.x * -8 + (long)local_968.p;
        local_a50 = -(long)local_9a8.begin.z;
        local_a88 = local_968.nstride * 8;
        local_a58 = local_968.kstride * 8;
        local_ad0 = (lVar13 - local_8d8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                    local_8e8._8_8_ * 8 + lVar9 * 8 +
                    (long)(int)local_8d8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage * -8 +
                    local_8e8._0_8_;
        local_a60 = -(long)local_968.begin.z;
        local_a90 = (long)local_8d8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish * 8;
        local_a68 = (long)local_8d8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start * 8;
        local_a70 = -(long)local_8c0;
        local_a28 = (ulong)(uint)local_abc.bigend.vect[1];
        lVar9 = 0;
        do {
          local_a78 = lVar9;
          iVar7 = local_abc.smallend.vect[2];
          if (local_abc.smallend.vect[2] <= local_abc.bigend.vect[2]) {
            do {
              if (local_abc.smallend.vect[1] <= local_abc.bigend.vect[1]) {
                lVar9 = (long)iVar7;
                lVar17 = (local_a40 + lVar9) * local_a38 + local_a30;
                lVar12 = (local_a50 + lVar9) * local_a48 + local_ae0;
                lVar15 = (local_a60 + lVar9) * local_a58 + local_ac8;
                lVar18 = (lVar9 + local_a70) * local_a68 + local_ad0;
                lVar9 = lVar13;
                do {
                  if (local_abc.smallend.vect[0] <= local_abc.bigend.vect[0]) {
                    lVar16 = 0;
                    do {
                      *(double *)(lVar18 + lVar16 * 8) =
                           ((*(double *)(lVar18 + lVar16 * 8) + *(double *)(lVar15 + lVar16 * 8)) -
                           *(double *)(lVar12 + lVar16 * 8)) / *(double *)(lVar17 + lVar16 * 8);
                      lVar16 = lVar16 + 1;
                    } while ((local_abc.bigend.vect[0] - local_abc.smallend.vect[0]) + 1 !=
                             (int)lVar16);
                  }
                  lVar9 = lVar9 + 1;
                  lVar17 = lVar17 + local_928.jstride * 8;
                  lVar12 = lVar12 + local_9a8.jstride * 8;
                  lVar15 = lVar15 + local_968.jstride * 8;
                  lVar18 = lVar18 + local_8e8._8_8_ * 8;
                } while (local_abc.bigend.vect[1] + 1U != (int)lVar9);
              }
              bVar5 = iVar7 != local_abc.bigend.vect[2];
              iVar7 = iVar7 + 1;
            } while (bVar5);
          }
          local_ae0 = local_ae0 + local_a80;
          local_ac8 = local_ac8 + local_a88;
          local_ad0 = local_ad0 + local_a90;
          lVar9 = local_a78 + 1;
        } while (local_a78 + 1 != 3);
        amrex::MFIter::operator++(&local_a08);
        this = local_a98;
        pNVar14 = local_a98;
      } while (local_a08.currentIndex < local_a08.endIndex);
    }
    amrex::MFIter::~MFIter(&local_a08);
    bVar5 = amrex::EBFArrayBoxFactory::isAllRegular
                      ((EBFArrayBoxFactory *)
                       (this->super_AmrLevel).m_factory._M_t.
                       super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                       .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                       _M_head_impl);
    if (bVar5) {
      iVar7 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
      pMVar4 = this->u_mac;
      Godunov::ExtrapVelToFaces
                (&local_4c0,(MultiFab *)&local_1b0,pMVar4,pMVar4 + 1,pMVar4 + 2,
                 &this->m_bcrec_velocity,(this->m_bcrec_velocity_d).m_data,geom,dt,iVar7 == 0,
                 godunov_use_forces_in_trans);
    }
    else {
      pMVar4 = this->u_mac;
      EBGodunov::ExtrapVelToFaces
                (&local_4c0,(MultiFab *)&local_1b0,pMVar4,pMVar4 + 1,pMVar4 + 2,
                 &this->m_bcrec_velocity,(this->m_bcrec_velocity_d).m_data,geom,dt);
    }
    amrex::MultiFab::~MultiFab((MultiFab *)&local_1b0);
    amrex::FillPatchIterator::~FillPatchIterator((FillPatchIterator *)local_758);
  }
  else {
    iVar7 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
    if (iVar7 == 0) {
      bVar5 = amrex::EBFArrayBoxFactory::isAllRegular
                        ((EBFArrayBoxFactory *)
                         (this->super_AmrLevel).m_factory._M_t.
                         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                         _M_head_impl);
      pMVar4 = this->u_mac;
      d_bcrec = (this->m_bcrec_velocity_d).m_data;
      if (bVar5) {
        MOL::ExtrapVelToFaces
                  (&local_4c0,pMVar4,pMVar4 + 1,pMVar4 + 2,geom,&this->m_bcrec_velocity,d_bcrec);
      }
      else {
        EBMOL::ExtrapVelToFaces
                  (&local_4c0,pMVar4,pMVar4 + 1,pMVar4 + 2,geom,&this->m_bcrec_velocity,d_bcrec);
      }
    }
    else {
      amrex::Abort_host("NSB::predict_velocity: Unkown advection_scheme");
    }
  }
  if (1 < verbose) {
    dVar20 = amrex::ParallelDescriptor::second();
    local_758._8_8_ = amrex::OutStream();
    local_758._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
    local_758._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_748);
    *(undefined8 *)((long)auStack_740 + (long)local_748[-3]) =
         *(undefined8 *)
          ((long)&(((BoxArray *)(local_758._8_8_ + 8))->m_bat).m_bat_type +
          (long)(*(_func_int ***)local_758._8_8_)[-3]);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_748,"NavierStokesBase::predict_velocity(): lev: ",0x2b);
    std::ostream::operator<<((ostringstream *)&local_748,(this->super_AmrLevel).level);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_748,", time: ",8);
    std::ostream::_M_insert<double>(dVar20 - local_aa0);
    local_8e8[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_748,local_8e8,1);
    amrex::Print::~Print((Print *)local_758);
  }
  if (local_a20.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (double *)0x0) {
    operator_delete(local_a20.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a20.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a20.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  amrex::FillPatchIterator::~FillPatchIterator((FillPatchIterator *)local_548);
  amrex::MultiFab::~MultiFab((MultiFab *)&local_330);
  return (double)ppMVar1 * dt;
}

Assistant:

Real
NavierStokesBase::predict_velocity (Real  dt)
{
   BL_PROFILE("NavierStokesBase::predict_velocity()");
   if (verbose) {
      amrex::Print() << "... predict edge velocities\n";
   }
   //
   // Get simulation parameters.
   //
   const int   nComp          = AMREX_SPACEDIM;
   const Real* dx             = geom.CellSize();
   const Real  prev_time      = state[State_Type].prevTime();
   const Real  prev_pres_time = state[Press_Type].prevTime();
   const Real  strt_time      = ParallelDescriptor::second();

   //
   // Compute viscous terms at level n.
   // Ensure reasonable values in 1 grow cell.  Here, do extrap for
   // c-f/phys boundary, since we have no interpolator fn, also,
   // preserve extrap for corners at periodic/non-periodic intersections.
   //
   MultiFab visc_terms(grids,dmap,nComp,nghost_force(),MFInfo(), Factory());

   FillPatchIterator U_fpi(*this,visc_terms,nghost_state(),prev_time,State_Type,Xvel,AMREX_SPACEDIM);
   MultiFab& Umf=U_fpi.get_mf();

   // Floor small values of states to be extrapolated
   floor(Umf);

   //
   // Compute "grid cfl number" based on cell-centered time-n velocities
   //
   auto umax = VectorMaxAbs({&Umf},FabArrayBase::mfiter_tile_size,0,AMREX_SPACEDIM,Umf.nGrow());
   Real cflmax = dt*umax[0]/dx[0];
   for (int d=1; d<AMREX_SPACEDIM; ++d) {
     cflmax = std::max(cflmax,dt*umax[d]/dx[d]);
   }
   Real tempdt = cflmax==0 ? change_max : std::min(change_max,cfl/cflmax);

   if ( advection_scheme == "Godunov_PLM" || advection_scheme == "Godunov_PPM" || advection_scheme == "BDS")
   {
       MultiFab& Gp = get_old_data(Gradp_Type);
       // FillPatch Gp here, as crse data has been updated
       // only really needed on the first step of the fine subcycle
       // because level_project at this level fills Gp ghost cells.
       // OR maybe better to not FP in level_proj for level>0 and do it
       // once the first time it's needed, which is presumably here...
       if ( level > 0 )
           FillPatch(*this,Gp,Gp.nGrow(),prev_pres_time,Gradp_Type,0,AMREX_SPACEDIM);

       if (be_cn_theta != 1.0)
       {
           getViscTerms(visc_terms,Xvel,nComp,prev_time);
       }
       else
       {
           visc_terms.setVal(0.0);
       }

       FillPatchIterator S_fpi(*this,visc_terms,nghost_state(),prev_time,State_Type,Density,NUM_SCALARS);
       MultiFab& Smf=S_fpi.get_mf();

       MultiFab forcing_term( grids, dmap, AMREX_SPACEDIM, nghost_force() );

       //
       // Compute forcing
       //
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
       {
           for (MFIter U_mfi(Umf,TilingIfNotGPU()); U_mfi.isValid(); ++U_mfi)
           {
               FArrayBox& Ufab = Umf[U_mfi];
               auto const  gbx = U_mfi.growntilebox(nghost_force());

               if (getForceVerbose) {
                   Print() << "---\nA - Predict velocity:\n Calling getForce...\n";
               }

               getForce(forcing_term[U_mfi],gbx,Xvel,AMREX_SPACEDIM,prev_time,Ufab,Smf[U_mfi],0,U_mfi);

               //
               // Compute the total forcing.
               //
               auto const& tf   = forcing_term.array(U_mfi,Xvel);
               auto const& visc = visc_terms.const_array(U_mfi,Xvel);
               auto const& gp   = Gp.const_array(U_mfi);
               auto const& rho  = Smf.const_array(U_mfi);

               amrex::ParallelFor(gbx, AMREX_SPACEDIM, [tf, visc, gp, rho]
               AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
               {
                   tf(i,j,k,n) = ( tf(i,j,k,n) + visc(i,j,k,n) - gp(i,j,k,n) ) / rho(i,j,k);
               });
           }
       }

#ifdef AMREX_USE_EB
       if (!EBFactory().isAllRegular())
       {
           EBGodunov::ExtrapVelToFaces( Umf, forcing_term,
                                        AMREX_D_DECL(u_mac[0], u_mac[1], u_mac[2]),
                                        m_bcrec_velocity, m_bcrec_velocity_d.dataPtr(),
                                        geom, dt );
       }
       else
#endif
       {
           bool godunov_use_ppm = ( advection_scheme == "Godunov_PPM" ? true : false );

           Godunov::ExtrapVelToFaces( Umf, forcing_term,
                                      AMREX_D_DECL(u_mac[0], u_mac[1], u_mac[2]),
                                      m_bcrec_velocity, m_bcrec_velocity_d.dataPtr(),
                                      geom, dt,
                                      godunov_use_ppm, godunov_use_forces_in_trans );
       }

   }
   else if ( advection_scheme == "MOL" )
   {
#ifdef AMREX_USE_EB
       if (!EBFactory().isAllRegular())
       {
            EBMOL::ExtrapVelToFaces( Umf,
                                     AMREX_D_DECL(u_mac[0], u_mac[1], u_mac[2]),
                                     geom, m_bcrec_velocity,m_bcrec_velocity_d.dataPtr());
       }
       else
#endif
       {
            MOL::ExtrapVelToFaces( Umf,
                                   AMREX_D_DECL(u_mac[0], u_mac[1], u_mac[2]),
                                   geom, m_bcrec_velocity,m_bcrec_velocity_d.dataPtr());
       }
   }
   else
   {
       Abort("NSB::predict_velocity: Unkown advection_scheme");
   }

   if (verbose > 1)
   {
      const int IOProc   = ParallelDescriptor::IOProcessorNumber();
      Real      run_time = ParallelDescriptor::second() - strt_time;

      ParallelDescriptor::ReduceRealMax(run_time,IOProc);

      Print() << "NavierStokesBase::predict_velocity(): lev: " << level
              << ", time: " << run_time << '\n';
   }

   return dt*tempdt;
}